

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::DisposeCurrentCmdBuffer
          (DeviceContextVkImpl *this,SoftwareQueueIndex CmdQueue,Uint64 FenceValue)

{
  bool bVar1;
  Char *Message;
  VkCommandBuffer vkCmdBuff_00;
  VkCommandBuffer vkCmdBuff;
  undefined1 local_40 [8];
  string msg;
  Uint64 FenceValue_local;
  DeviceContextVkImpl *this_local;
  SoftwareQueueIndex CmdQueue_local;
  
  msg.field_2._8_8_ = FenceValue;
  bVar1 = VulkanUtilities::VulkanCommandBuffer::IsInRenderScope(&this->m_CommandBuffer);
  if (bVar1) {
    FormatString<char[53]>
              ((string *)local_40,
               (char (*) [53])"Disposing command buffer with unfinished render pass");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DisposeCurrentCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x109);
    std::__cxx11::string::~string((string *)local_40);
  }
  vkCmdBuff_00 = VulkanUtilities::VulkanCommandBuffer::GetVkCmdBuffer(&this->m_CommandBuffer);
  if (vkCmdBuff_00 != (VkCommandBuffer)0x0) {
    DisposeVkCmdBuffer(this,CmdQueue,vkCmdBuff_00,msg.field_2._8_8_);
    VulkanUtilities::VulkanCommandBuffer::Reset(&this->m_CommandBuffer);
  }
  return;
}

Assistant:

inline void DeviceContextVkImpl::DisposeCurrentCmdBuffer(SoftwareQueueIndex CmdQueue, Uint64 FenceValue)
{
    VERIFY(!m_CommandBuffer.IsInRenderScope(), "Disposing command buffer with unfinished render pass");
    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        DisposeVkCmdBuffer(CmdQueue, vkCmdBuff, FenceValue);
        m_CommandBuffer.Reset();
    }
}